

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

void qpdf_oh_replace_or_remove_key(qpdf_data qpdf,qpdf_oh oh,char *key,qpdf_oh item)

{
  anon_class_24_3_bdf942aa local_60;
  function<void_(QPDFObjectHandle_&)> local_48;
  qpdf_oh local_24;
  char *pcStack_20;
  qpdf_oh item_local;
  char *key_local;
  qpdf_data p_Stack_10;
  qpdf_oh oh_local;
  qpdf_data qpdf_local;
  
  local_60.qpdf = qpdf;
  local_60.key = key;
  local_60.item = item;
  local_24 = item;
  pcStack_20 = key;
  key_local._4_4_ = oh;
  p_Stack_10 = qpdf;
  std::function<void(QPDFObjectHandle&)>::function<qpdf_oh_replace_or_remove_key::__0,void>
            ((function<void(QPDFObjectHandle&)> *)&local_48,&local_60);
  do_with_oh_void(qpdf,oh,&local_48);
  std::function<void_(QPDFObjectHandle_&)>::~function(&local_48);
  return;
}

Assistant:

void
qpdf_oh_replace_or_remove_key(qpdf_data qpdf, qpdf_oh oh, char const* key, qpdf_oh item)
{
    do_with_oh_void(qpdf, oh, [qpdf, key, item](QPDFObjectHandle& o) {
        QTC::TC("qpdf", "qpdf-c called qpdf_oh_replace_or_remove_key");
        o.replaceKey(key, qpdf_oh_item_internal(qpdf, item));
    });
}